

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeparser_p.h
# Opt level: O3

void __thiscall
QDateTimeParser::QDateTimeParser(QDateTimeParser *this,Type t,Context ctx,QCalendar cal)

{
  this->_vptr_QDateTimeParser = (_func_int **)&PTR__QDateTimeParser_0069f810;
  this->currentSectionIndex = -1;
  this->defaultCenturyStart = 0x76c;
  this->display = (QFlagsStorageHelper<QDateTimeParser::Section,_4>)0x0;
  this->cachedDay = -1;
  (this->m_text).d.d = (Data *)0x0;
  (this->m_text).d.ptr = (char16_t *)0x0;
  (this->m_text).d.size = 0;
  (this->sectionNodes).d.d = (Data *)0x0;
  (this->sectionNodes).d.ptr = (SectionNode *)0x0;
  (this->sectionNodes).d.size = 0;
  (this->separators).d.d = (Data *)0x0;
  (this->separators).d.ptr = (QString *)0x0;
  (this->separators).d.size = 0;
  (this->displayFormat).d.d = (Data *)0x0;
  (this->displayFormat).d.ptr = (char16_t *)0x0;
  (this->displayFormat).d.size = 0;
  systemData(&QLocale::system::locale.m_index);
  QLocale::system::locale.m_numberOptions.super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
  super_QFlagsStorage<QLocale::NumberOption>.i._1_3_ = 0;
  QLocale::system::locale.m_numberOptions.super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
  super_QFlagsStorage<QLocale::NumberOption>.i._0_1_ =
       (QLocale::system::locale.m_data)->m_language_id == 1;
  QLocale::QLocale(&this->defaultLocale,&QLocale::system::locale);
  this->parserType = t;
  this->fixday = false;
  this->context = ctx;
  (this->calendar).d_ptr = cal.d_ptr;
  return;
}

Assistant:

QDateTimeParser(QMetaType::Type t, Context ctx, QCalendar cal = QCalendar())
        : defaultLocale(QLocale::system()), parserType(t), context(ctx), calendar(cal)
    {
    }